

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

void __thiscall pstore::file::file_handle::seek(file_handle *this,uint64_t position)

{
  int err_00;
  unsigned_long *puVar1;
  __off_t _Var2;
  int *piVar3;
  string local_58;
  int local_34;
  uint64_t uStack_30;
  int err;
  unsigned_long local_28;
  unsigned_long offset;
  uint64_t uStack_18;
  int mode;
  uint64_t position_local;
  file_handle *this_local;
  
  uStack_18 = position;
  position_local = (uint64_t)this;
  ensure_open(this);
  offset._4_4_ = 0;
  do {
    uStack_30 = uStack_18;
    puVar1 = std::min<unsigned_long>(&stack0xffffffffffffffd0,&seek::max);
    local_28 = *puVar1;
    _Var2 = lseek(this->file_,local_28,offset._4_4_);
    if (_Var2 == -1) {
      piVar3 = __errno_location();
      err_00 = *piVar3;
      local_34 = err_00;
      path_abi_cxx11_(&local_58,this);
      (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
                (err_00,"lseek/SEEK_SET failed",&local_58);
    }
    uStack_18 = uStack_18 - local_28;
    offset._4_4_ = 1;
  } while (uStack_18 != 0);
  return;
}

Assistant:

void file_handle::seek (std::uint64_t position) {
            this->ensure_open ();

            using common_type = std::common_type<uoff_type, std::uint64_t>::type;
            static constexpr auto max =
                static_cast<common_type> (std::numeric_limits<off_t>::max ());

            int mode = SEEK_SET;
            do {
                auto const offset = std::min (static_cast<common_type> (position), max);

                if (::lseek (file_, static_cast<off_t> (offset), mode) == off_t{-1}) {
                    int const err = errno;
                    raise_file_error (err, "lseek/SEEK_SET failed", this->path ());
                }

                position -= offset;
                mode = SEEK_CUR;
            } while (position > 0);
        }